

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O2

int sfp_get_om4_length_copper_length(tcv_t *tcv)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = 0xfffffffc;
  if ((tcv != (tcv_t *)0x0) && (tcv->data != (void *)0x0)) {
    uVar2 = tcv_get_connector(tcv);
    if (((int)uVar2 < 0) || ((0xc < uVar2 || ((0x1fc2U >> (uVar2 & 0x1f) & 1) == 0)))) {
      bVar1 = *(byte *)((long)tcv->data + 0x13);
    }
    else {
      bVar1 = *(char *)((long)tcv->data + 0x13) * '\n';
    }
    uVar2 = 0xfffffff6;
    if (bVar1 != 0) {
      uVar2 = (uint)bVar1;
    }
  }
  return uVar2;
}

Assistant:

int sfp_get_om4_length_copper_length(tcv_t *tcv)
{
	unsigned char length;

	if (tcv == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Normalize length to meters. Optical link is measured in units of 10 meters
	 * and copper link is measured in units of 1 meter. */
	if (sfp_is_optical(tcv))
		length = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_LENGTH_OM4_10M_COPPER_1M] * 10;
	else
		length = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_LENGTH_OM4_10M_COPPER_1M];

	return length == 0 ? TCV_ERR_OM4_LENGTH_NOT_DEFINED : length;
}